

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_pointer.c
# Opt level: O2

int is_valid_index(char *path,size_t *idx)

{
  char *pcVar1;
  size_t sVar2;
  int *piVar3;
  ulong uVar4;
  byte bVar5;
  size_t sVar6;
  
  sVar2 = strlen(path);
  if (sVar2 == 1) {
    bVar5 = *path - 0x30;
    if (bVar5 < 10) {
      uVar4 = (ulong)bVar5;
LAB_00109a8f:
      *idx = uVar4;
      return 1;
    }
  }
  else if (*path != '0') {
    sVar6 = 0;
    do {
      if (sVar2 == sVar6) {
        uVar4 = strtoull(path,(char **)0x0,10);
        goto LAB_00109a8f;
      }
      pcVar1 = path + sVar6;
      sVar6 = sVar6 + 1;
    } while ((byte)(*pcVar1 - 0x30U) < 10);
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return 0;
}

Assistant:

static int is_valid_index(const char *path, size_t *idx)
{
	size_t i, len = strlen(path);
	/* this code-path optimizes a bit, for when we reference the 0-9 index range
	 * in a JSON array and because leading zeros not allowed
	 */
	if (len == 1)
	{
		if (is_plain_digit(path[0]))
		{
			*idx = (path[0] - '0');
			return 1;
		}
		errno = EINVAL;
		return 0;
	}
	/* leading zeros not allowed per RFC */
	if (path[0] == '0')
	{
		errno = EINVAL;
		return 0;
	}
	/* RFC states base-10 decimals */
	for (i = 0; i < len; i++)
	{
		if (!is_plain_digit(path[i]))
		{
			errno = EINVAL;
			return 0;
		}
	}

	// We know it's all digits, so the only error case here is overflow,
	// but ULLONG_MAX will be longer than any array length so that's ok.
	*idx = strtoull(path, NULL, 10);

	return 1;
}